

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O2

void server::rename_cmd(int cid,char **args,int argc)

{
  bool bVar1;
  uint cn;
  int iVar2;
  clientinfo *pcVar3;
  ENetPacket *packet;
  char *pcVar4;
  vector<unsigned_char> buf;
  packetbuf v;
  char newname [16];
  string oldname;
  
  bVar1 = QServ::getlastSA(&qs);
  if (bVar1) {
    cn = atoi(args[1]);
    pcVar4 = args[2];
    pcVar3 = QServ::getClient(&qs,cn);
    if (((pcVar4 != (char *)0x0 && pcVar3 != (clientinfo *)0x0) && (cn < 0x80)) &&
       (*pcVar4 != '\x01')) {
      newname[0xf] = '\0';
      filtertext(newname,pcVar4,false,true,0xf);
      putuint(&pcVar3->messages,0x68);
      sendstring(newname,&pcVar3->messages);
      buf.buf = (uchar *)0x0;
      buf.alen = 0;
      buf.ulen = 0;
      putuint(&buf,0x68);
      sendstring(newname,&buf);
      packetbuf::packetbuf(&v,5000,1);
      putuint(&v,0x58);
      putint(&v,pcVar3->clientnum);
      putint(&v,buf.ulen);
      packetbuf::put(&v,buf.buf,buf.ulen);
      iVar2 = pcVar3->clientnum;
      packet = packetbuf::finalize(&v);
      sendpacket(iVar2,1,packet,-1);
      copystring(oldname,pcVar3->name,0x104);
      copystring(pcVar3->name,newname,0x104);
      packetbuf::~packetbuf(&v);
      vector<unsigned_char>::~vector(&buf);
    }
    return;
  }
  iVar2 = QServ::getSender(&qs);
  pcVar4 = QServ::getCommandDesc(&qs,cid);
  sendf(iVar2,1,"ris",0x23,pcVar4);
  return;
}

Assistant:

QSERV_CALLBACK rename_cmd(p) {
        if(CMD_SA) {
            int cn = atoi(args[1]);
            char *name = args[2];
            clientinfo *ci = qs.getClient(cn);
            if(!ci || name == NULL || name[0] == 1 || cn < 0 || cn >= 128) return;
            char newname[MAXNAMELEN + 1];
            newname[MAXNAMELEN] = 0;
            filtertext(newname, name, false, MAXNAMELEN);
            putuint(ci->messages, N_SWITCHNAME);
            sendstring(newname, ci->messages);
            vector<uchar> buf;
            putuint(buf, N_SWITCHNAME);
            sendstring(newname, buf);
            packetbuf v(MAXTRANS, ENET_PACKET_FLAG_RELIABLE);
            putuint(v, N_CLIENT);
            putint(v, ci->clientnum);
            putint(v, buf.length());
            v.put(buf.getbuf(), buf.length());
            sendpacket(ci->clientnum, 1, v.finalize(), -1);
            string oldname;
            copystring(oldname, ci->name);
            copystring(ci->name, newname);
        }
        else sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
    }